

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O3

int amqp_destroy_connection(amqp_connection_state_t state)

{
  amqp_pool_table_entry_t_ *paVar1;
  amqp_pool_table_entry_t *__ptr;
  amqp_pool_table_entry_t *todelete;
  int i;
  long lVar2;
  
  if (state != (amqp_connection_state_t)0x0) {
    lVar2 = 0;
    do {
      __ptr = state->pool_table[lVar2];
      while (__ptr != (amqp_pool_table_entry_t *)0x0) {
        empty_amqp_pool(&__ptr->pool);
        paVar1 = __ptr->next;
        free(__ptr);
        __ptr = paVar1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
    free((state->outbound_buffer).bytes);
    free((state->sock_inbound_buffer).bytes);
    amqp_socket_delete(state->socket);
    empty_amqp_pool(&state->properties_pool);
    free(state);
  }
  return 0;
}

Assistant:

int amqp_destroy_connection(amqp_connection_state_t state) {
  int status = AMQP_STATUS_OK;
  if (state) {
    int i;
    for (i = 0; i < POOL_TABLE_SIZE; ++i) {
      amqp_pool_table_entry_t *entry = state->pool_table[i];
      while (NULL != entry) {
        amqp_pool_table_entry_t *todelete = entry;
        empty_amqp_pool(&entry->pool);
        entry = entry->next;
        free(todelete);
      }
    }

    free(state->outbound_buffer.bytes);
    free(state->sock_inbound_buffer.bytes);
    amqp_socket_delete(state->socket);
    empty_amqp_pool(&state->properties_pool);
    free(state);
  }
  return status;
}